

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

Amap_Cut_t * Amap_ManCutStore(Amap_Man_t *p,Amap_Cut_t *pCut,int fCompl)

{
  Amap_Cut_t *pAVar1;
  int Entry;
  Amap_Cut_t *pCut_00;
  Amap_Cut_t **ppAVar2;
  int nBytes;
  int iFan;
  Amap_Cut_t *pNew;
  int fCompl_local;
  Amap_Cut_t *pCut_local;
  Amap_Man_t *p_local;
  
  pCut_00 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemTemp,((uint)*pCut >> 0x11) * 4 + 0xc);
  *pCut_00 = (Amap_Cut_t)((uint)*pCut_00 & 0xffff0000 | (uint)*pCut & 0xffff);
  *pCut_00 = (Amap_Cut_t)
             ((uint)*pCut_00 & 0xfffeffff | (((uint)*pCut >> 0x10 & 1 ^ fCompl) & 1) << 0x10);
  *pCut_00 = (Amap_Cut_t)((uint)*pCut_00 & 0x1ffff | (uint)*pCut & 0xfffe0000);
  memcpy(pCut_00 + 1,pCut + 1,(ulong)((uint)*pCut >> 0x11) << 2);
  Entry = Abc_Var2Lit((uint)*pCut_00 & 0xffff,(uint)*pCut_00 >> 0x10 & 1);
  if (p->ppCutsTemp[Entry] == (Amap_Cut_t *)0x0) {
    Vec_IntPushOrder(p->vTemp,Entry);
  }
  pAVar1 = p->ppCutsTemp[Entry];
  ppAVar2 = Amap_ManCutNextP(pCut_00);
  *ppAVar2 = pAVar1;
  p->ppCutsTemp[Entry] = pCut_00;
  return pCut_00;
}

Assistant:

Amap_Cut_t * Amap_ManCutStore( Amap_Man_t * p, Amap_Cut_t * pCut, int fCompl )
{
    Amap_Cut_t * pNew;
    int iFan, nBytes = sizeof(Amap_Cut_t) + sizeof(int) * pCut->nFans + sizeof(Amap_Cut_t *);
    pNew = (Amap_Cut_t *)Aig_MmFlexEntryFetch( p->pMemTemp, nBytes );
    pNew->iMat  = pCut->iMat;
    pNew->fInv  = pCut->fInv ^ fCompl;
    pNew->nFans = pCut->nFans;
    memcpy( pNew->Fans, pCut->Fans, sizeof(int) * pCut->nFans );
    // add it to storage
    iFan = Abc_Var2Lit( pNew->iMat, pNew->fInv );
    if ( p->ppCutsTemp[ iFan ] == NULL )
        Vec_IntPushOrder( p->vTemp, iFan );
    *Amap_ManCutNextP( pNew ) = p->ppCutsTemp[ iFan ];
    p->ppCutsTemp[ iFan ] = pNew;
    return pNew;
}